

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

int run_test_process_ref(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_1;
  char *argv [3];
  size_t exepath_size;
  uv_process_options_t local_1d0;
  uv_process_t h;
  char exepath [256];
  
  argv[2] = (char *)0x0;
  argv[0] = (char *)0x0;
  argv[1] = "spawn_helper4";
  local_1d0.env = (char **)0x0;
  local_1d0.cwd = (char *)0x0;
  local_1d0.cpumask_size = 0;
  local_1d0.flags = 0;
  local_1d0.stdio_count = 0;
  local_1d0.stdio = (uv_stdio_container_t *)0x0;
  local_1d0.uid = 0;
  local_1d0.gid = 0;
  local_1d0.cpumask = (char *)0x0;
  exepath_size = 0x100;
  iVar1 = uv_exepath(exepath,&exepath_size);
  eval_b = (int64_t)iVar1;
  h.data = (void *)eval_b;
  if ((void *)eval_b == (void *)0x0) {
    local_1d0.args = argv;
    local_1d0.exit_cb = (uv_exit_cb)0x0;
    argv[0] = exepath;
    local_1d0.file = exepath;
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&h,&local_1d0);
    eval_b = (int64_t)iVar1;
    eval_b_1 = 0;
    if ((void *)eval_b == (void *)0x0) {
      uv_unref((uv_handle_t *)&h);
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      iVar1 = uv_process_kill(&h,0xf);
      eval_b = (int64_t)iVar1;
      eval_b_1 = 0;
      if ((void *)eval_b == (void *)0x0) {
        do_close(&h);
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        eval_b = 0;
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        eval_b_1 = (int64_t)iVar1;
        if (eval_b_1 == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar5 = "uv_loop_close(uv_default_loop())";
        pcVar4 = "0";
        uVar3 = 0x1af;
      }
      else {
        pcVar5 = "0";
        pcVar4 = "r";
        uVar3 = 0x1ab;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "r";
      uVar3 = 0x1a5;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "r";
    uVar3 = 0x19d;
    eval_b_1 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(process_ref) {
  /* spawn_helper4 blocks indefinitely. */
  char *argv[] = { NULL, "spawn_helper4", NULL };
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[256];
  uv_process_t h;
  int r;

  memset(&options, 0, sizeof(options));
  exepath_size = sizeof(exepath);

  r = uv_exepath(exepath, &exepath_size);
  ASSERT_OK(r);

  argv[0] = exepath;
  options.file = exepath;
  options.args = argv;
  options.exit_cb = NULL;

  r = uv_spawn(uv_default_loop(), &h, &options);
  ASSERT_OK(r);

  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  r = uv_process_kill(&h, /* SIGTERM */ 15);
  ASSERT_OK(r);

  do_close(&h);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}